

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

void __thiscall ot::commissioner::DtlsSession::Disconnect(DtlsSession *this,Error *aError)

{
  _Manager_type *pp_Var1;
  ConnectHandler *pCVar2;
  pointer pcVar3;
  char *pcVar4;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_c0;
  string local_a0;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  DtlsSession *local_58;
  char *local_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char> *local_38;
  code *local_30;
  
  if (this->mState - kConnecting < 2) {
    if ((this->mState == kConnected) && (aError->mCode == kCancelled)) {
      mbedtls_ssl_close_notify(&this->mSsl);
    }
    this->mState = kDisconnected;
    if ((this->mOnConnected).super__Function_base._M_manager != (_Manager_type)0x0) {
      pp_Var1 = &(this->mOnConnected).super__Function_base._M_manager;
      local_80._0_4_ = aError->mCode;
      pcVar3 = (aError->mMessage)._M_dataplus._M_p;
      local_78._M_p = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (aError->mMessage)._M_string_length);
      if (*pp_Var1 == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      pCVar2 = &this->mOnConnected;
      (*(this->mOnConnected)._M_invoker)((_Any_data *)pCVar2,this,(Error *)local_80);
      if (local_78._M_p != local_68) {
        operator_delete(local_78._M_p);
      }
      if (*pp_Var1 != (_Manager_type)0x0) {
        (**pp_Var1)((_Any_data *)pCVar2,(_Any_data *)pCVar2,__destroy_functor);
        *pp_Var1 = (_Manager_type)0x0;
        (this->mOnConnected)._M_invoker = (_Invoker_type)0x0;
      }
    }
    Reset(this);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"dtls","");
    local_58 = (DtlsSession *)CONCAT44(local_58._4_4_,pointer_type);
    local_50 = "session(={}) disconnected";
    local_48 = 0x19;
    local_40._0_4_ = 0;
    local_40._4_4_ = 1;
    local_30 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    begin = "session(={}) disconnected";
    local_38 = (format_string_checker<char> *)&local_58;
    do {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                           (begin,"",(format_string_checker<char> *)&local_58);
      }
      begin = pcVar4;
    } while (pcVar4 != "");
    fmt.size_ = 0xe;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    local_58 = this;
    ::fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)"session(={}) disconnected",fmt,args);
    Log(kDebug,&local_c0,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DtlsSession::Disconnect(Error aError)
{
    VerifyOrExit(mState == State::kConnecting || mState == State::kConnected);

    // Send close notify if the connected session is cancelled by user.
    if (mState == State::kConnected && aError == ErrorCode::kCancelled)
    {
        // We don't care if the notify has been successfully delivered.
        mbedtls_ssl_close_notify(&mSsl);
    }

    mState = State::kDisconnected;
    if (mOnConnected != nullptr)
    {
        mOnConnected(*this, aError);
        mOnConnected = nullptr;
    }

    // Reset to the initial state.
    Reset();

    LOG_DEBUG(LOG_REGION_DTLS, "session(={}) disconnected", static_cast<void *>(this));

exit:
    return;
}